

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

interval_t duckdb::TimestampRangeInfo::DefaultIncrement(void)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Default increment not implemented for timestamp range",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static interval_t DefaultIncrement() {
		throw InternalException("Default increment not implemented for timestamp range");
	}